

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::SubdivPatch1MBIntersectorK<8>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  GridSOA *pGVar15;
  Geometry *pGVar16;
  RTCFilterFunctionN p_Var17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  long lVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 (*pauVar56) [16];
  long lVar57;
  long lVar58;
  undefined1 auVar59 [24];
  int iVar60;
  undefined1 (*pauVar61) [16];
  uint uVar62;
  uint uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  GridSOA *pGVar68;
  ulong uVar69;
  AABBNodeMB4D *node1;
  ulong uVar70;
  GridSOA *pGVar71;
  ulong uVar72;
  vint4 bi_1;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar87 [32];
  undefined1 auVar86 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  vint4 bi;
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  vint4 ai;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar113;
  undefined4 uVar114;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  float fVar143;
  float fVar144;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar145 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1540 [16];
  float local_1520;
  float fStack_151c;
  undefined8 uStack_1518;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  GridSOA *local_1438;
  ulong local_1430;
  ulong local_1428;
  undefined1 local_1420 [8];
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  ulong local_13f8;
  RTCFilterFunctionNArguments local_13f0;
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [16];
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined1 local_1360 [32];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  GridSOA **local_1320;
  undefined1 local_1300 [32];
  float local_12e0 [4];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined4 local_10c0;
  undefined4 uStack_10bc;
  undefined4 uStack_10b8;
  undefined4 uStack_10b4;
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined4 uStack_10a8;
  undefined4 uStack_10a4;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar61 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar128._4_4_ = fVar1;
  auVar128._0_4_ = fVar1;
  auVar128._8_4_ = fVar1;
  auVar128._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar132._4_4_ = fVar2;
  auVar132._0_4_ = fVar2;
  auVar132._8_4_ = fVar2;
  auVar132._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar134._4_4_ = fVar3;
  auVar134._0_4_ = fVar3;
  auVar134._8_4_ = fVar3;
  auVar134._12_4_ = fVar3;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar69 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_13f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar65 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar72 = local_13f8 ^ 0x10;
  iVar60 = (tray->tfar).field_0.i[k];
  auVar84 = ZEXT1664(CONCAT412(iVar60,CONCAT48(iVar60,CONCAT44(iVar60,iVar60))));
  auVar138._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar138._8_4_ = -fVar1;
  auVar138._12_4_ = -fVar1;
  auVar141._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar141._8_4_ = -fVar2;
  auVar141._12_4_ = -fVar2;
  auVar145._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar145._8_4_ = -fVar3;
  auVar145._12_4_ = -fVar3;
  iVar60 = (tray->tnear).field_0.i[k];
  auVar160._4_4_ = iVar60;
  auVar160._0_4_ = iVar60;
  auVar160._8_4_ = iVar60;
  auVar160._12_4_ = iVar60;
  iVar60 = 1 << ((uint)k & 0x1f);
  auVar87._4_4_ = iVar60;
  auVar87._0_4_ = iVar60;
  auVar87._8_4_ = iVar60;
  auVar87._12_4_ = iVar60;
  auVar87._16_4_ = iVar60;
  auVar87._20_4_ = iVar60;
  auVar87._24_4_ = iVar60;
  auVar87._28_4_ = iVar60;
  auVar73 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar87 = vpand_avx2(auVar87,auVar73);
  local_1220 = vpcmpeqd_avx2(auVar87,auVar73);
LAB_00591531:
  do {
    pauVar56 = pauVar61 + -1;
    pauVar61 = pauVar61 + -1;
    if (*(float *)(*pauVar56 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar66 = *(ulong *)*pauVar61;
      while ((uVar66 & 8) == 0) {
        uVar70 = uVar66 & 0xfffffffffffffff0;
        uVar114 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar85._4_4_ = uVar114;
        auVar85._0_4_ = uVar114;
        auVar85._8_4_ = uVar114;
        auVar85._12_4_ = uVar114;
        auVar86 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar70 + 0x80 + uVar69),auVar85,
                                  *(undefined1 (*) [16])(uVar70 + 0x20 + uVar69));
        auVar86 = vfmadd213ps_fma(auVar86,auVar128,auVar138);
        auVar94 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar70 + 0x80 + local_13f8),auVar85,
                                  *(undefined1 (*) [16])(uVar70 + 0x20 + local_13f8));
        auVar94 = vfmadd213ps_fma(auVar94,auVar132,auVar141);
        auVar86 = vpmaxsd_avx(auVar86,auVar94);
        auVar94 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar70 + 0x80 + uVar65),auVar85,
                                  *(undefined1 (*) [16])(uVar70 + 0x20 + uVar65));
        auVar94 = vfmadd213ps_fma(auVar94,auVar134,auVar145);
        auVar94 = vpmaxsd_avx(auVar94,auVar160);
        local_1380 = vpmaxsd_avx(auVar86,auVar94);
        auVar86 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar70 + 0x80 + (uVar69 ^ 0x10)),auVar85,
                                  *(undefined1 (*) [16])(uVar70 + 0x20 + (uVar69 ^ 0x10)));
        auVar86 = vfmadd213ps_fma(auVar86,auVar128,auVar138);
        auVar94 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar70 + 0x80 + uVar72),auVar85,
                                  *(undefined1 (*) [16])(uVar70 + 0x20 + uVar72));
        auVar94 = vfmadd213ps_fma(auVar94,auVar132,auVar141);
        auVar86 = vpminsd_avx(auVar86,auVar94);
        auVar94 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar70 + 0x80 + (uVar65 ^ 0x10)),auVar85,
                                  *(undefined1 (*) [16])(uVar70 + 0x20 + (uVar65 ^ 0x10)));
        auVar94 = vfmadd213ps_fma(auVar94,auVar134,auVar145);
        auVar94 = vpminsd_avx(auVar94,auVar84._0_16_);
        auVar86 = vpminsd_avx(auVar86,auVar94);
        if (((uint)uVar66 & 7) == 6) {
          auVar94 = vcmpps_avx(local_1380,auVar86,2);
          auVar86 = vcmpps_avx(*(undefined1 (*) [16])(uVar70 + 0xe0),auVar85,2);
          auVar85 = vcmpps_avx(auVar85,*(undefined1 (*) [16])(uVar70 + 0xf0),1);
          auVar86 = vandps_avx(auVar86,auVar85);
          auVar86 = vandps_avx(auVar86,auVar94);
        }
        else {
          auVar86 = vcmpps_avx(local_1380,auVar86,2);
        }
        auVar86 = vpslld_avx(auVar86,0x1f);
        uVar62 = vmovmskps_avx(auVar86);
        if (uVar62 == 0) {
          if (pauVar61 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_00591531;
        }
        uVar62 = uVar62 & 0xff;
        lVar34 = 0;
        for (uVar66 = (ulong)uVar62; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
          lVar34 = lVar34 + 1;
        }
        uVar66 = *(ulong *)(uVar70 + lVar34 * 8);
        uVar62 = uVar62 - 1 & uVar62;
        uVar64 = (ulong)uVar62;
        if (uVar62 != 0) {
          uVar63 = *(uint *)(local_1380 + lVar34 * 4);
          lVar34 = 0;
          for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
            lVar34 = lVar34 + 1;
          }
          uVar62 = uVar62 - 1 & uVar62;
          uVar67 = (ulong)uVar62;
          uVar64 = *(ulong *)(uVar70 + lVar34 * 8);
          uVar14 = *(uint *)(local_1380 + lVar34 * 4);
          if (uVar62 == 0) {
            if (uVar63 < uVar14) {
              *(ulong *)*pauVar61 = uVar64;
              *(uint *)(*pauVar61 + 8) = uVar14;
              pauVar61 = pauVar61 + 1;
            }
            else {
              *(ulong *)*pauVar61 = uVar66;
              *(uint *)(*pauVar61 + 8) = uVar63;
              pauVar61 = pauVar61 + 1;
              uVar66 = uVar64;
            }
          }
          else {
            auVar86._8_8_ = 0;
            auVar86._0_8_ = uVar66;
            auVar86 = vpunpcklqdq_avx(auVar86,ZEXT416(uVar63));
            auVar94._8_8_ = 0;
            auVar94._0_8_ = uVar64;
            auVar94 = vpunpcklqdq_avx(auVar94,ZEXT416(uVar14));
            lVar34 = 0;
            for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
              lVar34 = lVar34 + 1;
            }
            uVar62 = uVar62 - 1 & uVar62;
            uVar66 = (ulong)uVar62;
            auVar97._8_8_ = 0;
            auVar97._0_8_ = *(ulong *)(uVar70 + lVar34 * 8);
            auVar97 = vpunpcklqdq_avx(auVar97,ZEXT416(*(uint *)(local_1380 + lVar34 * 4)));
            auVar85 = vpcmpgtd_avx(auVar94,auVar86);
            if (uVar62 == 0) {
              auVar105 = vpshufd_avx(auVar85,0xaa);
              auVar85 = vblendvps_avx(auVar94,auVar86,auVar105);
              auVar86 = vblendvps_avx(auVar86,auVar94,auVar105);
              auVar94 = vpcmpgtd_avx(auVar97,auVar85);
              auVar105 = vpshufd_avx(auVar94,0xaa);
              auVar94 = vblendvps_avx(auVar97,auVar85,auVar105);
              auVar85 = vblendvps_avx(auVar85,auVar97,auVar105);
              auVar97 = vpcmpgtd_avx(auVar85,auVar86);
              auVar105 = vpshufd_avx(auVar97,0xaa);
              auVar97 = vblendvps_avx(auVar85,auVar86,auVar105);
              auVar86 = vblendvps_avx(auVar86,auVar85,auVar105);
              *pauVar61 = auVar86;
              pauVar61[1] = auVar97;
              uVar66 = auVar94._0_8_;
              pauVar61 = pauVar61 + 2;
            }
            else {
              lVar34 = 0;
              for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                lVar34 = lVar34 + 1;
              }
              auVar105._8_8_ = 0;
              auVar105._0_8_ = *(ulong *)(uVar70 + lVar34 * 8);
              auVar106 = vpunpcklqdq_avx(auVar105,ZEXT416(*(uint *)(local_1380 + lVar34 * 4)));
              auVar105 = vpshufd_avx(auVar85,0xaa);
              auVar85 = vblendvps_avx(auVar94,auVar86,auVar105);
              auVar86 = vblendvps_avx(auVar86,auVar94,auVar105);
              auVar94 = vpcmpgtd_avx(auVar106,auVar97);
              auVar105 = vpshufd_avx(auVar94,0xaa);
              auVar94 = vblendvps_avx(auVar106,auVar97,auVar105);
              auVar97 = vblendvps_avx(auVar97,auVar106,auVar105);
              auVar105 = vpcmpgtd_avx(auVar97,auVar86);
              auVar106 = vpshufd_avx(auVar105,0xaa);
              auVar105 = vblendvps_avx(auVar97,auVar86,auVar106);
              auVar86 = vblendvps_avx(auVar86,auVar97,auVar106);
              auVar97 = vpcmpgtd_avx(auVar94,auVar85);
              auVar106 = vpshufd_avx(auVar97,0xaa);
              auVar97 = vblendvps_avx(auVar94,auVar85,auVar106);
              auVar94 = vblendvps_avx(auVar85,auVar94,auVar106);
              auVar85 = vpcmpgtd_avx(auVar105,auVar94);
              auVar106 = vpshufd_avx(auVar85,0xaa);
              auVar85 = vblendvps_avx(auVar105,auVar94,auVar106);
              auVar94 = vblendvps_avx(auVar94,auVar105,auVar106);
              *pauVar61 = auVar86;
              pauVar61[1] = auVar94;
              pauVar61[2] = auVar85;
              uVar66 = auVar97._0_8_;
              pauVar61 = pauVar61 + 3;
            }
          }
        }
      }
      if (((uint)uVar66 & 0xf) == 8) {
        pGVar15 = (pre->super_Precalculations).grid;
        fVar1 = (float)(*(int *)(pGVar15 + 8) - 1) * *(float *)(ray + k * 4 + 0xe0);
        uVar62 = *(uint *)(pGVar15 + 0xc);
        local_1430 = (ulong)uVar62;
        auVar86 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
        auVar86 = vminss_avx(auVar86,ZEXT416((uint)((float)(*(int *)(pGVar15 + 8) - 1) + -1.0)));
        auVar85 = vmaxss_avx(ZEXT816(0) << 0x20,auVar86);
        uVar63 = *(uint *)(pGVar15 + 0x10);
        local_1428 = (ulong)uVar63;
        lVar34 = (long)(int)auVar85._0_4_ * (ulong)*(uint *)(pGVar15 + 0x28) +
                 (ulong)*(uint *)(pGVar15 + 0x24);
        uVar66 = uVar66 >> 4;
        lVar57 = uVar66 * 4 + lVar34;
        lVar58 = uVar66 * 4 + lVar34 + 0x2c;
        auVar86 = *(undefined1 (*) [16])(pGVar15 + local_1430 * 4 + lVar57 + 0x2c);
        auVar94 = auVar86;
        if (2 < local_1428) {
          auVar94 = *(undefined1 (*) [16])(pGVar15 + local_1430 * 8 + lVar58);
        }
        local_1540 = *(undefined1 (*) [16])(pGVar15 + uVar66 * 4 + lVar34 + 0x2c);
        if (local_1430 == 2) {
          local_1540 = vshufps_avx(local_1540,local_1540,0x54);
          auVar86 = vshufps_avx(auVar86,auVar86,0x54);
          auVar94 = vshufps_avx(auVar94,auVar94,0x54);
        }
        uVar66 = (ulong)*(uint *)(pGVar15 + 0x14);
        pGVar68 = pGVar15 + uVar66 * 4 + lVar57 + 0x2c;
        auVar97 = *(undefined1 (*) [16])(pGVar68 + local_1430 * 4);
        auVar105 = auVar97;
        if (2 < uVar63) {
          auVar105 = *(undefined1 (*) [16])(pGVar68 + local_1430 * 8);
        }
        auVar106 = *(undefined1 (*) [16])pGVar68;
        if (uVar62 == 2) {
          auVar106 = vshufps_avx(auVar106,auVar106,0x54);
          auVar97 = vshufps_avx(auVar97,auVar97,0x54);
          auVar105 = vshufps_avx(auVar105,auVar105,0x54);
        }
        pGVar71 = pGVar15 + uVar66 * 8 + lVar57 + 0x2c;
        auVar7 = *(undefined1 (*) [16])(pGVar71 + local_1430 * 4);
        auVar110 = auVar7;
        if (2 < uVar63) {
          auVar110 = *(undefined1 (*) [16])(pGVar71 + local_1430 * 8);
        }
        auVar8 = *(undefined1 (*) [16])pGVar71;
        if (uVar62 == 2) {
          auVar8 = vshufps_avx(auVar8,auVar8,0x54);
          auVar7 = vshufps_avx(auVar7,auVar7,0x54);
          auVar110 = vshufps_avx(auVar110,auVar110,0x54);
        }
        uVar70 = (ulong)(*(uint *)(pGVar15 + 0x28) & 0xfffffffc);
        auVar9 = *(undefined1 (*) [16])(pGVar15 + local_1430 * 4 + uVar70 + lVar58);
        auVar124 = auVar9;
        if (2 < uVar63) {
          auVar124 = *(undefined1 (*) [16])(pGVar15 + local_1430 * 8 + uVar70 + lVar58);
        }
        auVar10 = *(undefined1 (*) [16])(pGVar15 + uVar70 + lVar58);
        if (uVar62 == 2) {
          auVar10 = vshufps_avx(auVar10,auVar10,0x54);
          auVar9 = vshufps_avx(auVar9,auVar9,0x54);
          auVar124 = vshufps_avx(auVar124,auVar124,0x54);
        }
        pGVar68 = pGVar68 + uVar70;
        auVar11 = *(undefined1 (*) [16])(pGVar68 + local_1430 * 4);
        auVar161 = auVar11;
        if (2 < uVar63) {
          auVar161 = *(undefined1 (*) [16])(pGVar68 + local_1430 * 8);
        }
        _local_1420 = *(undefined1 (*) [16])pGVar68;
        if (uVar62 == 2) {
          _local_1420 = vshufps_avx(_local_1420,_local_1420,0x54);
          auVar11 = vshufps_avx(auVar11,auVar11,0x54);
          auVar161 = vshufps_avx(auVar161,auVar161,0x54);
        }
        pGVar71 = pGVar71 + uVar70;
        auVar12 = *(undefined1 (*) [16])pGVar71;
        auVar13 = *(undefined1 (*) [16])(pGVar71 + local_1430 * 4);
        auVar129 = auVar13;
        if (2 < uVar63) {
          auVar129 = *(undefined1 (*) [16])(pGVar71 + local_1430 * 8);
        }
        fVar1 = fVar1 - auVar85._0_4_;
        auVar73._16_16_ = auVar86;
        auVar73._0_16_ = local_1540;
        auVar80._16_16_ = auVar94;
        auVar80._0_16_ = auVar86;
        auVar29 = vunpcklps_avx(auVar73,auVar80);
        auVar87 = vshufps_avx(auVar73,auVar73,0xa5);
        auVar73 = vshufps_avx(auVar80,auVar80,0x94);
        auVar112._16_16_ = auVar97;
        auVar112._0_16_ = auVar106;
        auVar139._16_16_ = auVar105;
        auVar139._0_16_ = auVar97;
        auVar30 = vunpcklps_avx(auVar112,auVar139);
        auVar80 = vshufps_avx(auVar112,auVar112,0xa5);
        auVar112 = vshufps_avx(auVar139,auVar139,0x94);
        auVar88._16_16_ = auVar7;
        auVar88._0_16_ = auVar8;
        auVar91._16_16_ = auVar110;
        auVar91._0_16_ = auVar7;
        auVar31 = vunpcklps_avx(auVar88,auVar91);
        auVar88 = vshufps_avx(auVar88,auVar88,0xa5);
        auVar91 = vshufps_avx(auVar91,auVar91,0x94);
        auVar74._16_16_ = auVar9;
        auVar74._0_16_ = auVar10;
        auVar116._16_16_ = auVar124;
        auVar116._0_16_ = auVar9;
        auVar32 = vunpcklps_avx(auVar74,auVar116);
        auVar74 = vshufps_avx(auVar74,auVar74,0xa5);
        auVar116 = vshufps_avx(auVar116,auVar116,0x94);
        auVar135._16_16_ = auVar11;
        auVar135._0_16_ = _local_1420;
        auVar146._16_16_ = auVar161;
        auVar146._0_16_ = auVar11;
        auVar33 = vunpcklps_avx(auVar135,auVar146);
        auVar135 = vshufps_avx(auVar135,auVar135,0xa5);
        auVar139 = vshufps_avx(auVar146,auVar146,0x94);
        if (uVar62 == 2) {
          auVar12 = vshufps_avx(auVar12,auVar12,0x54);
          auVar13 = vshufps_avx(auVar13,auVar13,0x54);
          auVar129 = vshufps_avx(auVar129,auVar129,0x54);
        }
        auVar147._16_16_ = auVar13;
        auVar147._0_16_ = auVar12;
        auVar133._16_16_ = auVar129;
        auVar133._0_16_ = auVar13;
        fVar2 = 1.0 - fVar1;
        auVar130._4_4_ = fVar2;
        auVar130._0_4_ = fVar2;
        auVar130._8_4_ = fVar2;
        auVar130._12_4_ = fVar2;
        auVar130._16_4_ = fVar2;
        auVar130._20_4_ = fVar2;
        auVar130._24_4_ = fVar2;
        auVar130._28_4_ = fVar2;
        auVar35._4_4_ = fVar1 * auVar32._4_4_;
        auVar35._0_4_ = fVar1 * auVar32._0_4_;
        auVar35._8_4_ = fVar1 * auVar32._8_4_;
        auVar35._12_4_ = fVar1 * auVar32._12_4_;
        auVar35._16_4_ = fVar1 * auVar32._16_4_;
        auVar35._20_4_ = fVar1 * auVar32._20_4_;
        auVar35._24_4_ = fVar1 * auVar32._24_4_;
        auVar35._28_4_ = auVar32._28_4_;
        auVar86 = vfmadd213ps_fma(auVar29,auVar130,auVar35);
        auVar29._4_4_ = fVar1 * auVar33._4_4_;
        auVar29._0_4_ = fVar1 * auVar33._0_4_;
        auVar29._8_4_ = fVar1 * auVar33._8_4_;
        auVar29._12_4_ = fVar1 * auVar33._12_4_;
        auVar29._16_4_ = fVar1 * auVar33._16_4_;
        auVar29._20_4_ = fVar1 * auVar33._20_4_;
        auVar29._24_4_ = fVar1 * auVar33._24_4_;
        auVar29._28_4_ = auVar32._28_4_;
        auVar94 = vfmadd213ps_fma(auVar30,auVar130,auVar29);
        auVar29 = vunpcklps_avx(auVar147,auVar133);
        auVar30._4_4_ = fVar1 * auVar29._4_4_;
        auVar30._0_4_ = fVar1 * auVar29._0_4_;
        auVar30._8_4_ = fVar1 * auVar29._8_4_;
        auVar30._12_4_ = fVar1 * auVar29._12_4_;
        auVar30._16_4_ = fVar1 * auVar29._16_4_;
        auVar30._20_4_ = fVar1 * auVar29._20_4_;
        auVar30._24_4_ = fVar1 * auVar29._24_4_;
        auVar30._28_4_ = auVar29._28_4_;
        auVar85 = vfmadd213ps_fma(auVar31,auVar130,auVar30);
        auVar31._4_4_ = fVar1 * auVar74._4_4_;
        auVar31._0_4_ = fVar1 * auVar74._0_4_;
        auVar31._8_4_ = fVar1 * auVar74._8_4_;
        auVar31._12_4_ = fVar1 * auVar74._12_4_;
        auVar31._16_4_ = fVar1 * auVar74._16_4_;
        auVar31._20_4_ = fVar1 * auVar74._20_4_;
        auVar31._24_4_ = fVar1 * auVar74._24_4_;
        auVar31._28_4_ = auVar74._28_4_;
        auVar97 = vfmadd213ps_fma(auVar87,auVar130,auVar31);
        local_1438 = pGVar15 + uVar66 * 0xc + lVar57 + 0x2c;
        auVar87 = vshufps_avx(auVar147,auVar147,0xa5);
        auVar74 = vshufps_avx(auVar133,auVar133,0x94);
        local_1420._0_4_ = auVar135._0_4_;
        local_1420._4_4_ = auVar135._4_4_;
        uStack_1418._0_4_ = auVar135._8_4_;
        uStack_1418._4_4_ = auVar135._12_4_;
        uStack_1410._0_4_ = auVar135._16_4_;
        uStack_1410._4_4_ = auVar135._20_4_;
        uStack_1408._0_4_ = auVar135._24_4_;
        auVar32._4_4_ = fVar1 * (float)local_1420._4_4_;
        auVar32._0_4_ = fVar1 * (float)local_1420._0_4_;
        auVar32._8_4_ = fVar1 * (float)uStack_1418;
        auVar32._12_4_ = fVar1 * uStack_1418._4_4_;
        auVar32._16_4_ = fVar1 * (float)uStack_1410;
        auVar32._20_4_ = fVar1 * uStack_1410._4_4_;
        auVar32._24_4_ = fVar1 * (float)uStack_1408;
        auVar32._28_4_ = auVar129._12_4_;
        auVar33._4_4_ = fVar1 * auVar87._4_4_;
        auVar33._0_4_ = fVar1 * auVar87._0_4_;
        auVar33._8_4_ = fVar1 * auVar87._8_4_;
        auVar33._12_4_ = fVar1 * auVar87._12_4_;
        auVar33._16_4_ = fVar1 * auVar87._16_4_;
        auVar33._20_4_ = fVar1 * auVar87._20_4_;
        auVar33._24_4_ = fVar1 * auVar87._24_4_;
        auVar33._28_4_ = auVar87._28_4_;
        auVar105 = vfmadd213ps_fma(auVar80,auVar130,auVar32);
        auVar106 = vfmadd213ps_fma(auVar88,auVar130,auVar33);
        local_1520 = auVar116._0_4_;
        fStack_151c = auVar116._4_4_;
        uStack_1518._0_4_ = auVar116._8_4_;
        uStack_1518._4_4_ = auVar116._12_4_;
        fStack_1510 = auVar116._16_4_;
        fStack_150c = auVar116._20_4_;
        fStack_1508 = auVar116._24_4_;
        auVar36._4_4_ = fVar1 * fStack_151c;
        auVar36._0_4_ = fVar1 * local_1520;
        auVar36._8_4_ = fVar1 * (float)uStack_1518;
        auVar36._12_4_ = fVar1 * uStack_1518._4_4_;
        auVar36._16_4_ = fVar1 * fStack_1510;
        auVar36._20_4_ = fVar1 * fStack_150c;
        auVar36._24_4_ = fVar1 * fStack_1508;
        auVar36._28_4_ = auVar87._28_4_;
        local_1460._0_4_ = auVar139._0_4_;
        local_1460._4_4_ = auVar139._4_4_;
        uStack_1458._0_4_ = auVar139._8_4_;
        uStack_1458._4_4_ = auVar139._12_4_;
        uStack_1450._0_4_ = auVar139._16_4_;
        uStack_1450._4_4_ = auVar139._20_4_;
        uStack_1448._0_4_ = auVar139._24_4_;
        auVar37._4_4_ = fVar1 * local_1460._4_4_;
        auVar37._0_4_ = fVar1 * (float)local_1460;
        auVar37._8_4_ = fVar1 * (float)uStack_1458;
        auVar37._12_4_ = fVar1 * uStack_1458._4_4_;
        auVar37._16_4_ = fVar1 * (float)uStack_1450;
        auVar37._20_4_ = fVar1 * uStack_1450._4_4_;
        auVar37._24_4_ = fVar1 * (float)uStack_1448;
        auVar37._28_4_ = auVar129._12_4_;
        auVar38._4_4_ = fVar1 * auVar74._4_4_;
        auVar38._0_4_ = fVar1 * auVar74._0_4_;
        auVar38._8_4_ = fVar1 * auVar74._8_4_;
        auVar38._12_4_ = fVar1 * auVar74._12_4_;
        auVar38._16_4_ = fVar1 * auVar74._16_4_;
        auVar38._20_4_ = fVar1 * auVar74._20_4_;
        auVar38._24_4_ = fVar1 * auVar74._24_4_;
        auVar38._28_4_ = auVar74._28_4_;
        auVar7 = vfmadd213ps_fma(auVar73,auVar130,auVar36);
        auVar110 = vfmadd213ps_fma(auVar112,auVar130,auVar37);
        auVar8 = vfmadd213ps_fma(auVar91,auVar130,auVar38);
        uVar114 = *(undefined4 *)(ray + k * 4);
        auVar75._4_4_ = uVar114;
        auVar75._0_4_ = uVar114;
        auVar75._8_4_ = uVar114;
        auVar75._12_4_ = uVar114;
        auVar75._16_4_ = uVar114;
        auVar75._20_4_ = uVar114;
        auVar75._24_4_ = uVar114;
        auVar75._28_4_ = uVar114;
        uVar114 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar131._4_4_ = uVar114;
        auVar131._0_4_ = uVar114;
        auVar131._8_4_ = uVar114;
        auVar131._12_4_ = uVar114;
        auVar131._16_4_ = uVar114;
        auVar131._20_4_ = uVar114;
        auVar131._24_4_ = uVar114;
        auVar131._28_4_ = uVar114;
        uVar114 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar136._4_4_ = uVar114;
        auVar136._0_4_ = uVar114;
        auVar136._8_4_ = uVar114;
        auVar136._12_4_ = uVar114;
        auVar136._16_4_ = uVar114;
        auVar136._20_4_ = uVar114;
        auVar136._24_4_ = uVar114;
        auVar136._28_4_ = uVar114;
        auVar112 = vsubps_avx(ZEXT1632(auVar86),auVar75);
        local_10e0 = vsubps_avx(ZEXT1632(auVar94),auVar131);
        local_1100 = vsubps_avx(ZEXT1632(auVar85),auVar136);
        auVar87 = vsubps_avx(ZEXT1632(auVar97),auVar75);
        auVar73 = vsubps_avx(ZEXT1632(auVar105),auVar131);
        auVar80 = vsubps_avx(ZEXT1632(auVar106),auVar136);
        auVar88 = vsubps_avx(ZEXT1632(auVar7),auVar75);
        auVar91 = vsubps_avx(ZEXT1632(auVar110),auVar131);
        auVar74 = vsubps_avx(ZEXT1632(auVar8),auVar136);
        local_1120 = vsubps_avx(auVar88,auVar112);
        local_1180 = vsubps_avx(auVar91,local_10e0);
        local_1140 = vsubps_avx(auVar74,local_1100);
        auVar89._0_4_ = auVar112._0_4_ + auVar88._0_4_;
        auVar89._4_4_ = auVar112._4_4_ + auVar88._4_4_;
        auVar89._8_4_ = auVar112._8_4_ + auVar88._8_4_;
        auVar89._12_4_ = auVar112._12_4_ + auVar88._12_4_;
        auVar89._16_4_ = auVar112._16_4_ + auVar88._16_4_;
        auVar89._20_4_ = auVar112._20_4_ + auVar88._20_4_;
        auVar89._24_4_ = auVar112._24_4_ + auVar88._24_4_;
        auVar89._28_4_ = auVar112._28_4_ + auVar88._28_4_;
        auVar103._0_4_ = auVar91._0_4_ + local_10e0._0_4_;
        auVar103._4_4_ = auVar91._4_4_ + local_10e0._4_4_;
        auVar103._8_4_ = auVar91._8_4_ + local_10e0._8_4_;
        auVar103._12_4_ = auVar91._12_4_ + local_10e0._12_4_;
        auVar103._16_4_ = auVar91._16_4_ + local_10e0._16_4_;
        auVar103._20_4_ = auVar91._20_4_ + local_10e0._20_4_;
        auVar103._24_4_ = auVar91._24_4_ + local_10e0._24_4_;
        fVar1 = local_10e0._28_4_;
        fVar113 = auVar91._28_4_;
        auVar103._28_4_ = fVar113 + fVar1;
        fVar143 = local_1100._0_4_;
        auVar137._0_4_ = fVar143 + auVar74._0_4_;
        fVar148 = local_1100._4_4_;
        auVar137._4_4_ = fVar148 + auVar74._4_4_;
        fVar150 = local_1100._8_4_;
        auVar137._8_4_ = fVar150 + auVar74._8_4_;
        fVar152 = local_1100._12_4_;
        auVar137._12_4_ = fVar152 + auVar74._12_4_;
        fVar154 = local_1100._16_4_;
        auVar137._16_4_ = fVar154 + auVar74._16_4_;
        fVar156 = local_1100._20_4_;
        auVar137._20_4_ = fVar156 + auVar74._20_4_;
        fVar158 = local_1100._24_4_;
        auVar137._24_4_ = fVar158 + auVar74._24_4_;
        auVar137._28_4_ = local_1100._28_4_ + auVar74._28_4_;
        auVar142._0_4_ = local_1140._0_4_ * auVar103._0_4_;
        auVar142._4_4_ = local_1140._4_4_ * auVar103._4_4_;
        auVar142._8_4_ = local_1140._8_4_ * auVar103._8_4_;
        auVar142._12_4_ = local_1140._12_4_ * auVar103._12_4_;
        auVar142._16_4_ = local_1140._16_4_ * auVar103._16_4_;
        auVar142._20_4_ = local_1140._20_4_ * auVar103._20_4_;
        auVar142._24_4_ = local_1140._24_4_ * auVar103._24_4_;
        auVar142._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar142,local_1180,auVar137);
        auVar140._0_4_ = auVar137._0_4_ * local_1120._0_4_;
        auVar140._4_4_ = auVar137._4_4_ * local_1120._4_4_;
        auVar140._8_4_ = auVar137._8_4_ * local_1120._8_4_;
        auVar140._12_4_ = auVar137._12_4_ * local_1120._12_4_;
        auVar140._16_4_ = auVar137._16_4_ * local_1120._16_4_;
        auVar140._20_4_ = auVar137._20_4_ * local_1120._20_4_;
        auVar140._24_4_ = auVar137._24_4_ * local_1120._24_4_;
        auVar140._28_4_ = 0;
        auVar86 = vfmsub231ps_fma(auVar140,local_1140,auVar89);
        auVar39._4_4_ = auVar89._4_4_ * local_1180._4_4_;
        auVar39._0_4_ = auVar89._0_4_ * local_1180._0_4_;
        auVar39._8_4_ = auVar89._8_4_ * local_1180._8_4_;
        auVar39._12_4_ = auVar89._12_4_ * local_1180._12_4_;
        auVar39._16_4_ = auVar89._16_4_ * local_1180._16_4_;
        auVar39._20_4_ = auVar89._20_4_ * local_1180._20_4_;
        auVar39._24_4_ = auVar89._24_4_ * local_1180._24_4_;
        auVar39._28_4_ = auVar89._28_4_;
        local_1160 = *(float *)(ray + k * 4 + 0xc0);
        auVar85 = vfmsub231ps_fma(auVar39,local_1120,auVar103);
        auVar40._4_4_ = local_1160 * auVar85._4_4_;
        auVar40._0_4_ = local_1160 * auVar85._0_4_;
        auVar40._8_4_ = local_1160 * auVar85._8_4_;
        auVar40._12_4_ = local_1160 * auVar85._12_4_;
        auVar40._16_4_ = local_1160 * 0.0;
        auVar40._20_4_ = local_1160 * 0.0;
        auVar40._24_4_ = local_1160 * 0.0;
        auVar40._28_4_ = local_1120._28_4_;
        uVar114 = *(undefined4 *)(ray + k * 4 + 0xa0);
        local_11a0._4_4_ = uVar114;
        local_11a0._0_4_ = uVar114;
        local_11a0._8_4_ = uVar114;
        local_11a0._12_4_ = uVar114;
        local_11a0._16_4_ = uVar114;
        local_11a0._20_4_ = uVar114;
        local_11a0._24_4_ = uVar114;
        local_11a0._28_4_ = uVar114;
        auVar86 = vfmadd231ps_fma(auVar40,local_11a0,ZEXT1632(auVar86));
        uVar114 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar76._4_4_ = uVar114;
        auVar76._0_4_ = uVar114;
        auVar76._8_4_ = uVar114;
        auVar76._12_4_ = uVar114;
        auVar76._16_4_ = uVar114;
        auVar76._20_4_ = uVar114;
        auVar76._24_4_ = uVar114;
        auVar76._28_4_ = uVar114;
        local_1380 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar76,ZEXT1632(auVar94));
        local_11c0 = vsubps_avx(local_10e0,auVar73);
        local_11e0 = vsubps_avx(local_1100,auVar80);
        auVar95._0_4_ = auVar73._0_4_ + local_10e0._0_4_;
        auVar95._4_4_ = auVar73._4_4_ + local_10e0._4_4_;
        auVar95._8_4_ = auVar73._8_4_ + local_10e0._8_4_;
        auVar95._12_4_ = auVar73._12_4_ + local_10e0._12_4_;
        auVar95._16_4_ = auVar73._16_4_ + local_10e0._16_4_;
        auVar95._20_4_ = auVar73._20_4_ + local_10e0._20_4_;
        auVar95._24_4_ = auVar73._24_4_ + local_10e0._24_4_;
        auVar95._28_4_ = auVar73._28_4_ + fVar1;
        auVar104._0_4_ = fVar143 + auVar80._0_4_;
        auVar104._4_4_ = fVar148 + auVar80._4_4_;
        auVar104._8_4_ = fVar150 + auVar80._8_4_;
        auVar104._12_4_ = fVar152 + auVar80._12_4_;
        auVar104._16_4_ = fVar154 + auVar80._16_4_;
        auVar104._20_4_ = fVar156 + auVar80._20_4_;
        auVar104._24_4_ = fVar158 + auVar80._24_4_;
        auVar104._28_4_ = local_1100._28_4_ + auVar80._28_4_;
        fVar2 = local_11e0._0_4_;
        fVar3 = local_11e0._4_4_;
        auVar41._4_4_ = auVar95._4_4_ * fVar3;
        auVar41._0_4_ = auVar95._0_4_ * fVar2;
        fVar19 = local_11e0._8_4_;
        auVar41._8_4_ = auVar95._8_4_ * fVar19;
        fVar21 = local_11e0._12_4_;
        auVar41._12_4_ = auVar95._12_4_ * fVar21;
        fVar23 = local_11e0._16_4_;
        auVar41._16_4_ = auVar95._16_4_ * fVar23;
        fVar25 = local_11e0._20_4_;
        auVar41._20_4_ = auVar95._20_4_ * fVar25;
        fVar27 = local_11e0._24_4_;
        auVar41._24_4_ = auVar95._24_4_ * fVar27;
        auVar41._28_4_ = fVar1;
        auVar94 = vfmsub231ps_fma(auVar41,local_11c0,auVar104);
        auVar116 = vsubps_avx(auVar112,auVar87);
        fVar144 = auVar116._0_4_;
        fVar149 = auVar116._4_4_;
        auVar42._4_4_ = fVar149 * auVar104._4_4_;
        auVar42._0_4_ = fVar144 * auVar104._0_4_;
        fVar151 = auVar116._8_4_;
        auVar42._8_4_ = fVar151 * auVar104._8_4_;
        fVar153 = auVar116._12_4_;
        auVar42._12_4_ = fVar153 * auVar104._12_4_;
        fVar155 = auVar116._16_4_;
        auVar42._16_4_ = fVar155 * auVar104._16_4_;
        fVar157 = auVar116._20_4_;
        auVar42._20_4_ = fVar157 * auVar104._20_4_;
        fVar159 = auVar116._24_4_;
        auVar42._24_4_ = fVar159 * auVar104._24_4_;
        auVar42._28_4_ = auVar104._28_4_;
        auVar125._0_4_ = auVar112._0_4_ + auVar87._0_4_;
        auVar125._4_4_ = auVar112._4_4_ + auVar87._4_4_;
        auVar125._8_4_ = auVar112._8_4_ + auVar87._8_4_;
        auVar125._12_4_ = auVar112._12_4_ + auVar87._12_4_;
        auVar125._16_4_ = auVar112._16_4_ + auVar87._16_4_;
        auVar125._20_4_ = auVar112._20_4_ + auVar87._20_4_;
        auVar125._24_4_ = auVar112._24_4_ + auVar87._24_4_;
        auVar125._28_4_ = auVar112._28_4_ + auVar87._28_4_;
        auVar86 = vfmsub231ps_fma(auVar42,local_11e0,auVar125);
        fVar1 = local_11c0._0_4_;
        fVar18 = local_11c0._4_4_;
        auVar43._4_4_ = auVar125._4_4_ * fVar18;
        auVar43._0_4_ = auVar125._0_4_ * fVar1;
        fVar20 = local_11c0._8_4_;
        auVar43._8_4_ = auVar125._8_4_ * fVar20;
        fVar22 = local_11c0._12_4_;
        auVar43._12_4_ = auVar125._12_4_ * fVar22;
        fVar24 = local_11c0._16_4_;
        auVar43._16_4_ = auVar125._16_4_ * fVar24;
        fVar26 = local_11c0._20_4_;
        auVar43._20_4_ = auVar125._20_4_ * fVar26;
        fVar28 = local_11c0._24_4_;
        auVar43._24_4_ = auVar125._24_4_ * fVar28;
        auVar43._28_4_ = auVar125._28_4_;
        auVar85 = vfmsub231ps_fma(auVar43,auVar116,auVar95);
        auVar44._4_4_ = auVar85._4_4_ * local_1160;
        auVar44._0_4_ = auVar85._0_4_ * local_1160;
        auVar44._8_4_ = auVar85._8_4_ * local_1160;
        auVar44._12_4_ = auVar85._12_4_ * local_1160;
        auVar44._16_4_ = local_1160 * 0.0;
        auVar44._20_4_ = local_1160 * 0.0;
        auVar44._24_4_ = local_1160 * 0.0;
        auVar44._28_4_ = local_11e0._28_4_;
        auVar86 = vfmadd231ps_fma(auVar44,local_11a0,ZEXT1632(auVar86));
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar76,ZEXT1632(auVar94));
        auVar135 = vsubps_avx(auVar87,auVar88);
        auVar98._0_4_ = auVar87._0_4_ + auVar88._0_4_;
        auVar98._4_4_ = auVar87._4_4_ + auVar88._4_4_;
        auVar98._8_4_ = auVar87._8_4_ + auVar88._8_4_;
        auVar98._12_4_ = auVar87._12_4_ + auVar88._12_4_;
        auVar98._16_4_ = auVar87._16_4_ + auVar88._16_4_;
        auVar98._20_4_ = auVar87._20_4_ + auVar88._20_4_;
        auVar98._24_4_ = auVar87._24_4_ + auVar88._24_4_;
        auVar98._28_4_ = auVar87._28_4_ + auVar88._28_4_;
        auVar88 = vsubps_avx(auVar73,auVar91);
        auVar77._0_4_ = auVar73._0_4_ + auVar91._0_4_;
        auVar77._4_4_ = auVar73._4_4_ + auVar91._4_4_;
        auVar77._8_4_ = auVar73._8_4_ + auVar91._8_4_;
        auVar77._12_4_ = auVar73._12_4_ + auVar91._12_4_;
        auVar77._16_4_ = auVar73._16_4_ + auVar91._16_4_;
        auVar77._20_4_ = auVar73._20_4_ + auVar91._20_4_;
        auVar77._24_4_ = auVar73._24_4_ + auVar91._24_4_;
        auVar77._28_4_ = auVar73._28_4_ + fVar113;
        auVar91 = vsubps_avx(auVar80,auVar74);
        auVar96._0_4_ = auVar80._0_4_ + auVar74._0_4_;
        auVar96._4_4_ = auVar80._4_4_ + auVar74._4_4_;
        auVar96._8_4_ = auVar80._8_4_ + auVar74._8_4_;
        auVar96._12_4_ = auVar80._12_4_ + auVar74._12_4_;
        auVar96._16_4_ = auVar80._16_4_ + auVar74._16_4_;
        auVar96._20_4_ = auVar80._20_4_ + auVar74._20_4_;
        auVar96._24_4_ = auVar80._24_4_ + auVar74._24_4_;
        auVar96._28_4_ = auVar80._28_4_ + auVar74._28_4_;
        auVar45._4_4_ = auVar91._4_4_ * auVar77._4_4_;
        auVar45._0_4_ = auVar91._0_4_ * auVar77._0_4_;
        auVar45._8_4_ = auVar91._8_4_ * auVar77._8_4_;
        auVar45._12_4_ = auVar91._12_4_ * auVar77._12_4_;
        auVar45._16_4_ = auVar91._16_4_ * auVar77._16_4_;
        auVar45._20_4_ = auVar91._20_4_ * auVar77._20_4_;
        auVar45._24_4_ = auVar91._24_4_ * auVar77._24_4_;
        auVar45._28_4_ = fVar113;
        auVar85 = vfmsub231ps_fma(auVar45,auVar88,auVar96);
        auVar46._4_4_ = auVar96._4_4_ * auVar135._4_4_;
        auVar46._0_4_ = auVar96._0_4_ * auVar135._0_4_;
        auVar46._8_4_ = auVar96._8_4_ * auVar135._8_4_;
        auVar46._12_4_ = auVar96._12_4_ * auVar135._12_4_;
        auVar46._16_4_ = auVar96._16_4_ * auVar135._16_4_;
        auVar46._20_4_ = auVar96._20_4_ * auVar135._20_4_;
        auVar46._24_4_ = auVar96._24_4_ * auVar135._24_4_;
        auVar46._28_4_ = auVar96._28_4_;
        auVar94 = vfmsub231ps_fma(auVar46,auVar91,auVar98);
        auVar47._4_4_ = auVar98._4_4_ * auVar88._4_4_;
        auVar47._0_4_ = auVar98._0_4_ * auVar88._0_4_;
        auVar47._8_4_ = auVar98._8_4_ * auVar88._8_4_;
        auVar47._12_4_ = auVar98._12_4_ * auVar88._12_4_;
        auVar47._16_4_ = auVar98._16_4_ * auVar88._16_4_;
        auVar47._20_4_ = auVar98._20_4_ * auVar88._20_4_;
        auVar47._24_4_ = auVar98._24_4_ * auVar88._24_4_;
        auVar47._28_4_ = auVar98._28_4_;
        auVar97 = vfmsub231ps_fma(auVar47,auVar135,auVar77);
        fStack_115c = local_1160;
        fStack_1158 = local_1160;
        fStack_1154 = local_1160;
        fStack_1150 = local_1160;
        fStack_114c = local_1160;
        fStack_1148 = local_1160;
        fStack_1144 = local_1160;
        auVar99._0_4_ = local_1160 * auVar97._0_4_;
        auVar99._4_4_ = local_1160 * auVar97._4_4_;
        auVar99._8_4_ = local_1160 * auVar97._8_4_;
        auVar99._12_4_ = local_1160 * auVar97._12_4_;
        auVar99._16_4_ = local_1160 * 0.0;
        auVar99._20_4_ = local_1160 * 0.0;
        auVar99._24_4_ = local_1160 * 0.0;
        auVar99._28_4_ = 0;
        auVar94 = vfmadd231ps_fma(auVar99,local_11a0,ZEXT1632(auVar94));
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar76,ZEXT1632(auVar85));
        auVar106._0_8_ =
             CONCAT44(auVar94._4_4_ + local_1380._4_4_ + auVar86._4_4_,
                      auVar94._0_4_ + local_1380._0_4_ + auVar86._0_4_);
        auVar106._8_4_ = auVar94._8_4_ + local_1380._8_4_ + auVar86._8_4_;
        auVar106._12_4_ = auVar94._12_4_ + local_1380._12_4_ + auVar86._12_4_;
        auVar74 = ZEXT1632(auVar106);
        auVar87 = vminps_avx(ZEXT1632(local_1380),ZEXT1632(auVar86));
        auVar87 = vminps_avx(auVar87,ZEXT1632(auVar94));
        auVar78._8_4_ = 0x7fffffff;
        auVar78._0_8_ = 0x7fffffff7fffffff;
        auVar78._12_4_ = 0x7fffffff;
        auVar78._16_4_ = 0x7fffffff;
        auVar78._20_4_ = 0x7fffffff;
        auVar78._24_4_ = 0x7fffffff;
        auVar78._28_4_ = 0x7fffffff;
        local_1200 = vandps_avx(auVar74,auVar78);
        fVar113 = local_1200._0_4_ * 1.1920929e-07;
        fVar118 = local_1200._4_4_ * 1.1920929e-07;
        auVar48._4_4_ = fVar118;
        auVar48._0_4_ = fVar113;
        fVar119 = local_1200._8_4_ * 1.1920929e-07;
        auVar48._8_4_ = fVar119;
        fVar120 = local_1200._12_4_ * 1.1920929e-07;
        auVar48._12_4_ = fVar120;
        fVar121 = local_1200._16_4_ * 1.1920929e-07;
        auVar48._16_4_ = fVar121;
        fVar122 = local_1200._20_4_ * 1.1920929e-07;
        auVar48._20_4_ = fVar122;
        fVar123 = local_1200._24_4_ * 1.1920929e-07;
        auVar48._24_4_ = fVar123;
        auVar48._28_4_ = local_1200._28_4_;
        auVar126._0_8_ = CONCAT44(fVar118,fVar113) ^ 0x8000000080000000;
        auVar126._8_4_ = -fVar119;
        auVar126._12_4_ = -fVar120;
        auVar126._16_4_ = -fVar121;
        auVar126._20_4_ = -fVar122;
        auVar126._24_4_ = -fVar123;
        auVar126._28_4_ = local_1200._28_4_ ^ 0x80000000;
        auVar87 = vcmpps_avx(auVar87,auVar126,5);
        auVar80 = vmaxps_avx(ZEXT1632(local_1380),ZEXT1632(auVar86));
        auVar73 = vmaxps_avx(auVar80,ZEXT1632(auVar94));
        auVar73 = vcmpps_avx(auVar73,auVar48,2);
        auVar87 = vorps_avx(auVar87,auVar73);
        uVar114 = *(undefined4 *)(ray + k * 4 + 0x100);
        if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar87 >> 0x7f,0) != '\0') ||
              (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar87 >> 0xbf,0) != '\0') ||
            (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar87[0x1f] < '\0') {
          auVar49._4_4_ = fVar18 * local_1140._4_4_;
          auVar49._0_4_ = fVar1 * local_1140._0_4_;
          auVar49._8_4_ = fVar20 * local_1140._8_4_;
          auVar49._12_4_ = fVar22 * local_1140._12_4_;
          auVar49._16_4_ = fVar24 * local_1140._16_4_;
          auVar49._20_4_ = fVar26 * local_1140._20_4_;
          auVar49._24_4_ = fVar28 * local_1140._24_4_;
          auVar49._28_4_ = auVar73._28_4_;
          auVar115._0_4_ = fVar144 * local_1180._0_4_;
          auVar115._4_4_ = fVar149 * local_1180._4_4_;
          auVar115._8_4_ = fVar151 * local_1180._8_4_;
          auVar115._12_4_ = fVar153 * local_1180._12_4_;
          auVar115._16_4_ = fVar155 * local_1180._16_4_;
          auVar115._20_4_ = fVar157 * local_1180._20_4_;
          auVar115._24_4_ = fVar159 * local_1180._24_4_;
          auVar115._28_4_ = 0;
          auVar94 = vfmsub213ps_fma(local_1180,local_11e0,auVar49);
          auVar50._4_4_ = fVar3 * auVar88._4_4_;
          auVar50._0_4_ = fVar2 * auVar88._0_4_;
          auVar50._8_4_ = fVar19 * auVar88._8_4_;
          auVar50._12_4_ = fVar21 * auVar88._12_4_;
          auVar50._16_4_ = fVar23 * auVar88._16_4_;
          auVar50._20_4_ = fVar25 * auVar88._20_4_;
          auVar50._24_4_ = fVar27 * auVar88._24_4_;
          auVar50._28_4_ = auVar80._28_4_;
          auVar51._4_4_ = fVar149 * auVar91._4_4_;
          auVar51._0_4_ = fVar144 * auVar91._0_4_;
          auVar51._8_4_ = fVar151 * auVar91._8_4_;
          auVar51._12_4_ = fVar153 * auVar91._12_4_;
          auVar51._16_4_ = fVar155 * auVar91._16_4_;
          auVar51._20_4_ = fVar157 * auVar91._20_4_;
          auVar51._24_4_ = fVar159 * auVar91._24_4_;
          auVar51._28_4_ = 0x34000000;
          auVar85 = vfmsub213ps_fma(auVar91,local_11c0,auVar50);
          auVar73 = vandps_avx(auVar49,auVar78);
          auVar80 = vandps_avx(auVar50,auVar78);
          auVar73 = vcmpps_avx(auVar73,auVar80,1);
          local_1280 = vblendvps_avx(ZEXT1632(auVar85),ZEXT1632(auVar94),auVar73);
          auVar52._4_4_ = fVar18 * auVar135._4_4_;
          auVar52._0_4_ = fVar1 * auVar135._0_4_;
          auVar52._8_4_ = fVar20 * auVar135._8_4_;
          auVar52._12_4_ = fVar22 * auVar135._12_4_;
          auVar52._16_4_ = fVar24 * auVar135._16_4_;
          auVar52._20_4_ = fVar26 * auVar135._20_4_;
          auVar52._24_4_ = fVar28 * auVar135._24_4_;
          auVar52._28_4_ = auVar73._28_4_;
          auVar94 = vfmsub213ps_fma(auVar135,local_11e0,auVar51);
          auVar53._4_4_ = local_1120._4_4_ * fVar3;
          auVar53._0_4_ = local_1120._0_4_ * fVar2;
          auVar53._8_4_ = local_1120._8_4_ * fVar19;
          auVar53._12_4_ = local_1120._12_4_ * fVar21;
          auVar53._16_4_ = local_1120._16_4_ * fVar23;
          auVar53._20_4_ = local_1120._20_4_ * fVar25;
          auVar53._24_4_ = local_1120._24_4_ * fVar27;
          auVar53._28_4_ = auVar80._28_4_;
          auVar85 = vfmsub213ps_fma(local_1140,auVar116,auVar53);
          auVar73 = vandps_avx(auVar53,auVar78);
          auVar80 = vandps_avx(auVar51,auVar78);
          auVar73 = vcmpps_avx(auVar73,auVar80,1);
          local_1260 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar85),auVar73);
          auVar94 = vfmsub213ps_fma(local_1120,local_11c0,auVar115);
          auVar85 = vfmsub213ps_fma(auVar88,auVar116,auVar52);
          auVar73 = vandps_avx(auVar115,auVar78);
          auVar80 = vandps_avx(auVar52,auVar78);
          auVar73 = vcmpps_avx(auVar73,auVar80,1);
          local_1240 = vblendvps_avx(ZEXT1632(auVar85),ZEXT1632(auVar94),auVar73);
          auVar94 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
          auVar79._0_4_ = local_1240._0_4_ * local_1160;
          auVar79._4_4_ = local_1240._4_4_ * local_1160;
          auVar79._8_4_ = local_1240._8_4_ * local_1160;
          auVar79._12_4_ = local_1240._12_4_ * local_1160;
          auVar79._16_4_ = local_1240._16_4_ * local_1160;
          auVar79._20_4_ = local_1240._20_4_ * local_1160;
          auVar79._24_4_ = local_1240._24_4_ * local_1160;
          auVar79._28_4_ = 0;
          auVar85 = vfmadd213ps_fma(local_11a0,local_1260,auVar79);
          auVar85 = vfmadd213ps_fma(auVar76,local_1280,ZEXT1632(auVar85));
          auVar80 = ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                       CONCAT48(auVar85._8_4_ + auVar85._8_4_,
                                                CONCAT44(auVar85._4_4_ + auVar85._4_4_,
                                                         auVar85._0_4_ + auVar85._0_4_))));
          auVar100._0_4_ = local_1240._0_4_ * fVar143;
          auVar100._4_4_ = local_1240._4_4_ * fVar148;
          auVar100._8_4_ = local_1240._8_4_ * fVar150;
          auVar100._12_4_ = local_1240._12_4_ * fVar152;
          auVar100._16_4_ = local_1240._16_4_ * fVar154;
          auVar100._20_4_ = local_1240._20_4_ * fVar156;
          auVar100._24_4_ = local_1240._24_4_ * fVar158;
          auVar100._28_4_ = 0;
          auVar85 = vfmadd213ps_fma(local_10e0,local_1260,auVar100);
          auVar97 = vfmadd213ps_fma(auVar112,local_1280,ZEXT1632(auVar85));
          auVar87 = vrcpps_avx(auVar80);
          auVar127._8_4_ = 0x3f800000;
          auVar127._0_8_ = 0x3f8000003f800000;
          auVar127._12_4_ = 0x3f800000;
          auVar127._16_4_ = 0x3f800000;
          auVar127._20_4_ = 0x3f800000;
          auVar127._24_4_ = 0x3f800000;
          auVar127._28_4_ = 0x3f800000;
          auVar85 = vfnmadd213ps_fma(auVar87,auVar80,auVar127);
          auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar87,auVar87);
          auVar54._28_4_ = 0x3f800000;
          auVar54._0_28_ =
               ZEXT1628(CONCAT412((auVar97._12_4_ + auVar97._12_4_) * auVar85._12_4_,
                                  CONCAT48((auVar97._8_4_ + auVar97._8_4_) * auVar85._8_4_,
                                           CONCAT44((auVar97._4_4_ + auVar97._4_4_) * auVar85._4_4_,
                                                    (auVar97._0_4_ + auVar97._0_4_) * auVar85._0_4_)
                                          )));
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar101._4_4_ = uVar4;
          auVar101._0_4_ = uVar4;
          auVar101._8_4_ = uVar4;
          auVar101._12_4_ = uVar4;
          auVar101._16_4_ = uVar4;
          auVar101._20_4_ = uVar4;
          auVar101._24_4_ = uVar4;
          auVar101._28_4_ = uVar4;
          auVar87 = vcmpps_avx(auVar101,auVar54,2);
          auVar107._4_4_ = uVar114;
          auVar107._0_4_ = uVar114;
          auVar107._8_4_ = uVar114;
          auVar107._12_4_ = uVar114;
          auVar107._16_4_ = uVar114;
          auVar107._20_4_ = uVar114;
          auVar107._24_4_ = uVar114;
          auVar107._28_4_ = uVar114;
          auVar73 = vcmpps_avx(auVar54,auVar107,2);
          auVar87 = vandps_avx(auVar87,auVar73);
          auVar85 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
          auVar94 = vpand_avx(auVar85,auVar94);
          auVar87 = vpmovsxwd_avx2(auVar94);
          if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar87 >> 0x7f,0) != '\0') ||
                (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar87 >> 0xbf,0) != '\0') ||
              (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar87[0x1f] < '\0') {
            auVar87 = vcmpps_avx(auVar80,_DAT_01faff00,4);
            auVar85 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
            auVar94 = vpand_avx(auVar94,auVar85);
            local_1300 = vpmovsxwd_avx2(auVar94);
            if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_1300 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_1300 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_1300 >> 0x7f,0) != '\0') ||
                  (local_1300 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_1300 >> 0xbf,0) != '\0') ||
                (local_1300 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_1300[0x1f] < '\0') {
              uStack_1458._0_4_ = *(float *)(pGVar15 + 0x18);
              local_1420._4_4_ = *(undefined4 *)(pGVar15 + 0x1c);
              uStack_1370 = 0;
              uStack_1368 = 0;
              local_1360 = ZEXT1632(auVar86);
              uStack_1518 = auVar106._8_8_;
              local_1340 = auVar106._0_8_;
              uStack_1338 = uStack_1518;
              uStack_1330 = 0;
              uStack_1328 = 0;
              local_1320 = &local_1438;
              local_12a0 = auVar54;
              pGVar16 = (context->scene->geometries).items[(uint)(float)uStack_1458].ptr;
              if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                auVar94 = *(undefined1 (*) [16])(local_1438 + local_1430 * 4);
                auVar85 = auVar94;
                if (2 < local_1428) {
                  auVar85 = *(undefined1 (*) [16])(local_1438 + local_1430 * 8);
                }
                auVar87 = vrcpps_avx(auVar74);
                auVar111._8_4_ = 0x3f800000;
                auVar111._0_8_ = 0x3f8000003f800000;
                auVar111._12_4_ = 0x3f800000;
                auVar111._16_4_ = 0x3f800000;
                auVar111._20_4_ = 0x3f800000;
                auVar111._24_4_ = 0x3f800000;
                auVar111._28_4_ = 0x3f800000;
                auVar97 = vfnmadd213ps_fma(auVar74,auVar87,auVar111);
                auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar87,auVar87);
                auVar81._8_4_ = 0x219392ef;
                auVar81._0_8_ = 0x219392ef219392ef;
                auVar81._12_4_ = 0x219392ef;
                auVar81._16_4_ = 0x219392ef;
                auVar81._20_4_ = 0x219392ef;
                auVar81._24_4_ = 0x219392ef;
                auVar81._28_4_ = 0x219392ef;
                auVar73 = vcmpps_avx(local_1200,auVar81,5);
                auVar87 = vandps_avx(auVar73,ZEXT1632(auVar97));
                auVar55._4_4_ = auVar87._4_4_ * local_1380._4_4_;
                auVar55._0_4_ = auVar87._0_4_ * local_1380._0_4_;
                auVar55._8_4_ = auVar87._8_4_ * local_1380._8_4_;
                auVar55._12_4_ = auVar87._12_4_ * local_1380._12_4_;
                auVar55._16_4_ = auVar87._16_4_ * 0.0;
                auVar55._20_4_ = auVar87._20_4_ * 0.0;
                auVar55._24_4_ = auVar87._24_4_ * 0.0;
                auVar55._28_4_ = auVar73._28_4_;
                auVar73 = vminps_avx(auVar55,auVar111);
                auVar90._0_4_ = auVar87._0_4_ * auVar86._0_4_;
                auVar90._4_4_ = auVar87._4_4_ * auVar86._4_4_;
                auVar90._8_4_ = auVar87._8_4_ * auVar86._8_4_;
                auVar90._12_4_ = auVar87._12_4_ * auVar86._12_4_;
                auVar90._16_4_ = auVar87._16_4_ * 0.0;
                auVar90._20_4_ = auVar87._20_4_ * 0.0;
                auVar90._24_4_ = auVar87._24_4_ * 0.0;
                auVar90._28_4_ = 0;
                auVar87 = vminps_avx(auVar90,auVar111);
                auVar86 = *(undefined1 (*) [16])local_1438;
                if (local_1430 == 2) {
                  auVar86 = vpshufd_avx(auVar86,0x54);
                  auVar94 = vpshufd_avx(auVar94,0x54);
                  auVar85 = vpshufd_avx(auVar85,0x54);
                }
                auVar108._0_16_ = ZEXT116(0) * auVar94 + ZEXT116(1) * auVar86;
                auVar108._16_16_ = ZEXT116(1) * auVar94;
                auVar102._0_16_ = ZEXT116(0) * auVar85 + ZEXT116(1) * auVar94;
                auVar102._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar85;
                auVar80 = vpunpckldq_avx2(auVar108,auVar102);
                auVar88 = vpshufd_avx2(auVar108,0xa5);
                auVar74 = vpshufd_avx2(auVar102,0x94);
                auVar112 = vpsrld_avx2(auVar80,0x10);
                auVar91 = ZEXT1232(ZEXT412(0)) << 0x20;
                auVar80 = vpblendw_avx2(auVar80,auVar91,0xaa);
                auVar80 = vcvtdq2ps_avx(auVar80);
                auVar112 = vcvtdq2ps_avx(auVar112);
                auVar116 = vpsrld_avx2(auVar88,0x10);
                auVar88 = vpblendw_avx2(auVar88,auVar91,0xaa);
                auVar88 = vcvtdq2ps_avx(auVar88);
                auVar91 = vcvtdq2ps_avx(auVar116);
                auVar116 = vpsrld_avx2(auVar74,0x10);
                auVar74 = vpblendw_avx2(auVar74,ZEXT1232(ZEXT412(0)) << 0x20,0xaa);
                auVar74 = vcvtdq2ps_avx(auVar74);
                auVar116 = vcvtdq2ps_avx(auVar116);
                auVar109._0_4_ =
                     auVar116._0_4_ * 0.00012207031 * auVar87._0_4_ +
                     auVar73._0_4_ * auVar91._0_4_ * 0.00012207031;
                auVar109._4_4_ =
                     auVar116._4_4_ * 0.00012207031 * auVar87._4_4_ +
                     auVar73._4_4_ * auVar91._4_4_ * 0.00012207031;
                auVar109._8_4_ =
                     auVar116._8_4_ * 0.00012207031 * auVar87._8_4_ +
                     auVar73._8_4_ * auVar91._8_4_ * 0.00012207031;
                auVar109._12_4_ =
                     auVar116._12_4_ * 0.00012207031 * auVar87._12_4_ +
                     auVar73._12_4_ * auVar91._12_4_ * 0.00012207031;
                auVar109._16_4_ =
                     auVar116._16_4_ * 0.00012207031 * auVar87._16_4_ +
                     auVar73._16_4_ * auVar91._16_4_ * 0.00012207031;
                auVar109._20_4_ =
                     auVar116._20_4_ * 0.00012207031 * auVar87._20_4_ +
                     auVar73._20_4_ * auVar91._20_4_ * 0.00012207031;
                auVar109._24_4_ =
                     auVar116._24_4_ * 0.00012207031 * auVar87._24_4_ +
                     auVar73._24_4_ * auVar91._24_4_ * 0.00012207031;
                auVar109._28_4_ = auVar88._28_4_ + auVar91._28_4_;
                auVar117._8_4_ = 0x3f800000;
                auVar117._0_8_ = 0x3f8000003f800000;
                auVar117._12_4_ = 0x3f800000;
                auVar117._16_4_ = 0x3f800000;
                auVar117._20_4_ = 0x3f800000;
                auVar117._24_4_ = 0x3f800000;
                auVar117._28_4_ = 0x3f800000;
                auVar91 = vsubps_avx(auVar117,auVar73);
                auVar91 = vsubps_avx(auVar91,auVar87);
                local_12e0[0] =
                     auVar87._0_4_ * auVar74._0_4_ * 0.00012207031 +
                     auVar73._0_4_ * auVar88._0_4_ * 0.00012207031 +
                     auVar91._0_4_ * auVar80._0_4_ * 0.00012207031;
                local_12e0[1] =
                     auVar87._4_4_ * auVar74._4_4_ * 0.00012207031 +
                     auVar73._4_4_ * auVar88._4_4_ * 0.00012207031 +
                     auVar91._4_4_ * auVar80._4_4_ * 0.00012207031;
                local_12e0[2] =
                     auVar87._8_4_ * auVar74._8_4_ * 0.00012207031 +
                     auVar73._8_4_ * auVar88._8_4_ * 0.00012207031 +
                     auVar91._8_4_ * auVar80._8_4_ * 0.00012207031;
                local_12e0[3] =
                     auVar87._12_4_ * auVar74._12_4_ * 0.00012207031 +
                     auVar73._12_4_ * auVar88._12_4_ * 0.00012207031 +
                     auVar91._12_4_ * auVar80._12_4_ * 0.00012207031;
                fStack_12d0 = auVar87._16_4_ * auVar74._16_4_ * 0.00012207031 +
                              auVar73._16_4_ * auVar88._16_4_ * 0.00012207031 +
                              auVar91._16_4_ * auVar80._16_4_ * 0.00012207031;
                fStack_12cc = auVar87._20_4_ * auVar74._20_4_ * 0.00012207031 +
                              auVar73._20_4_ * auVar88._20_4_ * 0.00012207031 +
                              auVar91._20_4_ * auVar80._20_4_ * 0.00012207031;
                fStack_12c8 = auVar87._24_4_ * auVar74._24_4_ * 0.00012207031 +
                              auVar73._24_4_ * auVar88._24_4_ * 0.00012207031 +
                              auVar91._24_4_ * auVar80._24_4_ * 0.00012207031;
                fStack_12c4 = auVar74._28_4_ + auVar88._28_4_ + auVar87._28_4_;
                local_12c0[0] = auVar109._0_4_ + auVar91._0_4_ * auVar112._0_4_ * 0.00012207031;
                local_12c0[1] = auVar109._4_4_ + auVar91._4_4_ * auVar112._4_4_ * 0.00012207031;
                local_12c0[2] = auVar109._8_4_ + auVar91._8_4_ * auVar112._8_4_ * 0.00012207031;
                local_12c0[3] = auVar109._12_4_ + auVar91._12_4_ * auVar112._12_4_ * 0.00012207031;
                fStack_12b0 = auVar109._16_4_ + auVar91._16_4_ * auVar112._16_4_ * 0.00012207031;
                fStack_12ac = auVar109._20_4_ + auVar91._20_4_ * auVar112._20_4_ * 0.00012207031;
                fStack_12a8 = auVar109._24_4_ + auVar91._24_4_ * auVar112._24_4_ * 0.00012207031;
                fStack_12a4 = auVar109._28_4_ + auVar91._28_4_;
                auVar82._8_4_ = 0x7f800000;
                auVar82._0_8_ = 0x7f8000007f800000;
                auVar82._12_4_ = 0x7f800000;
                auVar82._16_4_ = 0x7f800000;
                auVar82._20_4_ = 0x7f800000;
                auVar82._24_4_ = 0x7f800000;
                auVar82._28_4_ = 0x7f800000;
                auVar87 = vblendvps_avx(auVar82,auVar54,local_1300);
                auVar73 = vshufps_avx(auVar87,auVar87,0xb1);
                auVar73 = vminps_avx(auVar87,auVar73);
                auVar80 = vshufpd_avx(auVar73,auVar73,5);
                auVar73 = vminps_avx(auVar73,auVar80);
                auVar80 = vpermpd_avx2(auVar73,0x4e);
                auVar73 = vminps_avx(auVar73,auVar80);
                auVar73 = vcmpps_avx(auVar87,auVar73,0);
                auVar80 = local_1300 & auVar73;
                auVar87 = local_1300;
                if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar80 >> 0x7f,0) != '\0') ||
                      (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar80 >> 0xbf,0) != '\0') ||
                    (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar80[0x1f] < '\0') {
                  auVar87 = vandps_avx(auVar73,local_1300);
                }
                auVar73 = vpcmpeqd_avx2(auVar109,auVar109);
                auVar84 = ZEXT3264(auVar73);
                uVar63 = vmovmskps_avx(auVar87);
                uVar62 = 0;
                for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
                  uVar62 = uVar62 + 1;
                }
                uVar66 = (ulong)uVar62;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar1 = local_12e0[uVar66];
                  fVar2 = local_12c0[uVar66];
                  uVar4 = *(undefined4 *)(local_1280 + uVar66 * 4);
                  uVar5 = *(undefined4 *)(local_1260 + uVar66 * 4);
                  uVar6 = *(undefined4 *)(local_1240 + uVar66 * 4);
                  uVar114 = *(undefined4 *)(local_12a0 + uVar66 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar114;
                  *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar5;
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar6;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar1;
                  *(float *)(ray + k * 4 + 0x200) = fVar2;
                  *(undefined4 *)(ray + k * 4 + 0x220) = local_1420._4_4_;
                  *(float *)(ray + k * 4 + 0x240) = (float)uStack_1458;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  local_1460 = CONCAT44((float)uStack_1458,(float)uStack_1458);
                  uStack_1458._4_4_ = (float)uStack_1458;
                  uStack_1450._0_4_ = (float)uStack_1458;
                  uStack_1450._4_4_ = (float)uStack_1458;
                  auVar59 = _local_1460;
                  uStack_1448._0_4_ = (float)uStack_1458;
                  uStack_1448._4_4_ = (float)uStack_1458;
                  auVar87 = _local_1460;
                  local_1420._0_4_ = local_1420._4_4_;
                  uStack_1418._0_4_ = (float)local_1420._4_4_;
                  uStack_1418._4_4_ = (float)local_1420._4_4_;
                  uStack_1410._0_4_ = (float)local_1420._4_4_;
                  uStack_1410._4_4_ = (float)local_1420._4_4_;
                  uStack_1408._0_4_ = (float)local_1420._4_4_;
                  uStack_1408._4_4_ = local_1420._4_4_;
                  local_13c0 = local_1300;
                  while( true ) {
                    local_1060 = local_12e0[uVar66];
                    local_1040 = local_12c0[uVar66];
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_12a0 + uVar66 * 4);
                    local_10c0 = *(undefined4 *)(local_1280 + uVar66 * 4);
                    uVar4 = *(undefined4 *)(local_1260 + uVar66 * 4);
                    local_10a0._4_4_ = uVar4;
                    local_10a0._0_4_ = uVar4;
                    local_10a0._8_4_ = uVar4;
                    local_10a0._12_4_ = uVar4;
                    local_10a0._16_4_ = uVar4;
                    local_10a0._20_4_ = uVar4;
                    local_10a0._24_4_ = uVar4;
                    local_10a0._28_4_ = uVar4;
                    uVar4 = *(undefined4 *)(local_1240 + uVar66 * 4);
                    local_1080._4_4_ = uVar4;
                    local_1080._0_4_ = uVar4;
                    local_1080._8_4_ = uVar4;
                    local_1080._12_4_ = uVar4;
                    local_1080._16_4_ = uVar4;
                    local_1080._20_4_ = uVar4;
                    local_1080._24_4_ = uVar4;
                    local_1080._28_4_ = uVar4;
                    local_13f0.context = context->user;
                    uStack_10bc = local_10c0;
                    uStack_10b8 = local_10c0;
                    uStack_10b4 = local_10c0;
                    uStack_10b0 = local_10c0;
                    uStack_10ac = local_10c0;
                    uStack_10a8 = local_10c0;
                    uStack_10a4 = local_10c0;
                    fStack_105c = local_1060;
                    fStack_1058 = local_1060;
                    fStack_1054 = local_1060;
                    fStack_1050 = local_1060;
                    fStack_104c = local_1060;
                    fStack_1048 = local_1060;
                    fStack_1044 = local_1060;
                    fStack_103c = local_1040;
                    fStack_1038 = local_1040;
                    fStack_1034 = local_1040;
                    fStack_1030 = local_1040;
                    fStack_102c = local_1040;
                    fStack_1028 = local_1040;
                    fStack_1024 = local_1040;
                    local_1020 = local_1420;
                    uStack_1018 = uStack_1418;
                    uStack_1010 = uStack_1410;
                    uStack_1008 = uStack_1408;
                    uStack_1450 = auVar59._16_8_;
                    uStack_1448 = auVar87._24_8_;
                    local_1000 = local_1460;
                    uStack_ff8 = uStack_1458;
                    uStack_ff0 = uStack_1450;
                    uStack_fe8 = uStack_1448;
                    uStack_fdc = (local_13f0.context)->instID[0];
                    local_fe0 = uStack_fdc;
                    uStack_fd8 = uStack_fdc;
                    uStack_fd4 = uStack_fdc;
                    uStack_fd0 = uStack_fdc;
                    uStack_fcc = uStack_fdc;
                    uStack_fc8 = uStack_fdc;
                    uStack_fc4 = uStack_fdc;
                    uStack_fbc = (local_13f0.context)->instPrimID[0];
                    local_fc0 = uStack_fbc;
                    uStack_fb8 = uStack_fbc;
                    uStack_fb4 = uStack_fbc;
                    uStack_fb0 = uStack_fbc;
                    uStack_fac = uStack_fbc;
                    uStack_fa8 = uStack_fbc;
                    uStack_fa4 = uStack_fbc;
                    local_13a0 = local_1220;
                    local_13f0.valid = (int *)local_13a0;
                    local_13f0.geometryUserPtr = pGVar16->userPtr;
                    local_13f0.hit = (RTCHitN *)&local_10c0;
                    local_13f0.N = 8;
                    local_13f0.ray = (RTCRayN *)ray;
                    if (pGVar16->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar73 = ZEXT1632(auVar84._0_16_);
                      (*pGVar16->intersectionFilterN)(&local_13f0);
                      auVar73 = vpcmpeqd_avx2(auVar73,auVar73);
                      auVar84 = ZEXT3264(auVar73);
                    }
                    auVar80 = vpcmpeqd_avx2(local_13a0,_DAT_01faff00);
                    auVar73 = auVar84._0_32_ & ~auVar80;
                    if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar73 >> 0x7f,0) == '\0') &&
                          (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar73 >> 0xbf,0) == '\0') &&
                        (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar73[0x1f]) {
                      auVar80 = auVar80 ^ auVar84._0_32_;
                    }
                    else {
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar73 = ZEXT1632(auVar84._0_16_);
                        (*p_Var17)(&local_13f0);
                        auVar73 = vpcmpeqd_avx2(auVar73,auVar73);
                        auVar84 = ZEXT3264(auVar73);
                      }
                      auVar112 = vpcmpeqd_avx2(local_13a0,_DAT_01faff00);
                      auVar80 = auVar112 ^ auVar84._0_32_;
                      auVar73 = auVar84._0_32_ & ~auVar112;
                      if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar73 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar73 >> 0x7f,0) != '\0') ||
                            (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar73 >> 0xbf,0) != '\0') ||
                          (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar73[0x1f] < '\0') {
                        auVar92._0_4_ = auVar112._0_4_ ^ auVar84._0_4_;
                        auVar92._4_4_ = auVar112._4_4_ ^ auVar84._4_4_;
                        auVar92._8_4_ = auVar112._8_4_ ^ auVar84._8_4_;
                        auVar92._12_4_ = auVar112._12_4_ ^ auVar84._12_4_;
                        auVar92._16_4_ = auVar112._16_4_ ^ auVar84._16_4_;
                        auVar92._20_4_ = auVar112._20_4_ ^ auVar84._20_4_;
                        auVar92._24_4_ = auVar112._24_4_ ^ auVar84._24_4_;
                        auVar92._28_4_ = auVar112._28_4_ ^ auVar84._28_4_;
                        auVar73 = vmaskmovps_avx(auVar92,*(undefined1 (*) [32])local_13f0.hit);
                        *(undefined1 (*) [32])(local_13f0.ray + 0x180) = auVar73;
                        auVar73 = vmaskmovps_avx(auVar92,*(undefined1 (*) [32])
                                                          (local_13f0.hit + 0x20));
                        *(undefined1 (*) [32])(local_13f0.ray + 0x1a0) = auVar73;
                        auVar73 = vmaskmovps_avx(auVar92,*(undefined1 (*) [32])
                                                          (local_13f0.hit + 0x40));
                        *(undefined1 (*) [32])(local_13f0.ray + 0x1c0) = auVar73;
                        auVar73 = vmaskmovps_avx(auVar92,*(undefined1 (*) [32])
                                                          (local_13f0.hit + 0x60));
                        *(undefined1 (*) [32])(local_13f0.ray + 0x1e0) = auVar73;
                        auVar73 = vmaskmovps_avx(auVar92,*(undefined1 (*) [32])
                                                          (local_13f0.hit + 0x80));
                        *(undefined1 (*) [32])(local_13f0.ray + 0x200) = auVar73;
                        auVar73 = vpmaskmovd_avx2(auVar92,*(undefined1 (*) [32])
                                                           (local_13f0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_13f0.ray + 0x220) = auVar73;
                        auVar73 = vpmaskmovd_avx2(auVar92,*(undefined1 (*) [32])
                                                           (local_13f0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_13f0.ray + 0x240) = auVar73;
                        auVar73 = vpmaskmovd_avx2(auVar92,*(undefined1 (*) [32])
                                                           (local_13f0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_13f0.ray + 0x260) = auVar73;
                        auVar73 = vpmaskmovd_avx2(auVar92,*(undefined1 (*) [32])
                                                           (local_13f0.hit + 0x100));
                        *(undefined1 (*) [32])(local_13f0.ray + 0x280) = auVar73;
                      }
                    }
                    if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar80 >> 0x7f,0) == '\0') &&
                          (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar80 >> 0xbf,0) == '\0') &&
                        (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar80[0x1f]) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar114;
                    }
                    else {
                      uVar114 = *(undefined4 *)(ray + k * 4 + 0x100);
                    }
                    *(undefined4 *)(local_13c0 + uVar66 * 4) = 0;
                    auVar83._4_4_ = uVar114;
                    auVar83._0_4_ = uVar114;
                    auVar83._8_4_ = uVar114;
                    auVar83._12_4_ = uVar114;
                    auVar83._16_4_ = uVar114;
                    auVar83._20_4_ = uVar114;
                    auVar83._24_4_ = uVar114;
                    auVar83._28_4_ = uVar114;
                    auVar80 = vcmpps_avx(auVar54,auVar83,2);
                    auVar73 = vandps_avx(auVar80,local_13c0);
                    local_13c0 = local_13c0 & auVar80;
                    if ((((((((local_13c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_13c0 >> 0x3f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0) &&
                            (local_13c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                           && SUB321(local_13c0 >> 0x7f,0) == '\0') &&
                          (local_13c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_13c0 >> 0xbf,0) == '\0') &&
                        (local_13c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_13c0[0x1f]) break;
                    auVar93._8_4_ = 0x7f800000;
                    auVar93._0_8_ = 0x7f8000007f800000;
                    auVar93._12_4_ = 0x7f800000;
                    auVar93._16_4_ = 0x7f800000;
                    auVar93._20_4_ = 0x7f800000;
                    auVar93._24_4_ = 0x7f800000;
                    auVar93._28_4_ = 0x7f800000;
                    auVar80 = vblendvps_avx(auVar93,auVar54,auVar73);
                    auVar112 = vshufps_avx(auVar80,auVar80,0xb1);
                    auVar112 = vminps_avx(auVar80,auVar112);
                    auVar88 = vshufpd_avx(auVar112,auVar112,5);
                    auVar112 = vminps_avx(auVar112,auVar88);
                    auVar88 = vpermpd_avx2(auVar112,0x4e);
                    auVar112 = vminps_avx(auVar112,auVar88);
                    auVar112 = vcmpps_avx(auVar80,auVar112,0);
                    auVar88 = auVar73 & auVar112;
                    auVar80 = auVar73;
                    if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar88 >> 0x7f,0) != '\0') ||
                          (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar88 >> 0xbf,0) != '\0') ||
                        (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar88[0x1f] < '\0') {
                      auVar80 = vandps_avx(auVar112,auVar73);
                    }
                    uVar63 = vmovmskps_avx(auVar80);
                    uVar62 = 0;
                    for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
                      uVar62 = uVar62 + 1;
                    }
                    uVar66 = (ulong)uVar62;
                    local_13c0 = auVar73;
                  }
                }
              }
            }
          }
        }
        auVar84 = ZEXT1664(CONCAT412(uVar114,CONCAT48(uVar114,CONCAT44(uVar114,uVar114))));
      }
      else {
        lVar34 = *(long *)*(GridSOA **)(uVar66 & 0xfffffffffffffff0);
        (pre->super_Precalculations).grid = *(GridSOA **)(uVar66 & 0xfffffffffffffff0);
        uVar114 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar84 = ZEXT1664(CONCAT412(uVar114,CONCAT48(uVar114,CONCAT44(uVar114,uVar114))));
        if (lVar34 != 0) {
          *(long *)*pauVar61 = lVar34;
          *(undefined4 *)(*pauVar61 + 8) = 0;
          pauVar61 = pauVar61 + 1;
        }
      }
    }
    if (pauVar61 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }